

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsitrf.c
# Opt level: O1

void zgsitrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,
            void *work,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,
            GlobalLU_t *Glu,SuperLUStat_t *stat,int_t *info)

{
  undefined8 *puVar1;
  uint n;
  milu_t milu;
  int_t *piVar2;
  long lVar3;
  int *piVar4;
  int *piVar5;
  int_t *piVar6;
  int_t *piVar7;
  double dVar8;
  doublecomplex drop_sum_00;
  int *marker_00;
  long lVar9;
  int_t iVar10;
  int iVar11;
  int iVar12;
  int_t iVar13;
  int *addr;
  ulong uVar14;
  int_t *iswap;
  double *amax;
  int_t *piVar15;
  ulong uVar16;
  double dVar17;
  int iVar18;
  double dVar19;
  int *piVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  doublecomplex *z;
  long lVar24;
  uint n_00;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  double dVar32;
  int local_278;
  int nnzLj;
  int pivrow;
  double local_268;
  int_t *local_260;
  int *local_258;
  int_t *local_250;
  double local_248;
  double local_240;
  double local_238;
  int_t nnzL;
  int usepr;
  int nseg;
  ulong local_220;
  long local_218;
  int *marker;
  ulong local_208;
  long local_200;
  SuperMatrix *local_1f8;
  ulong local_1f0;
  double local_1e8;
  double fill_tol;
  int local_1d4;
  fact_t local_1d0;
  int nseg1;
  double *local_1c8;
  int_t *local_1c0;
  int_t *local_1b8;
  doublecomplex *dense;
  int *repfnz;
  int *segrep;
  int_t *local_198;
  int *local_190;
  double local_188;
  int *local_180;
  doublecomplex *tempv;
  int local_170;
  int nnzUj;
  int_t nnzU;
  int_t nzlumax;
  doublecomplex drop_sum;
  int *local_118;
  int_t *xplore;
  double local_c0;
  double local_b8;
  flops_t *local_b0;
  int *local_a8;
  long local_a0;
  double local_98;
  int *panel_lsub;
  int *parent;
  doublecomplex *zwork;
  int *iwork;
  ulong local_70;
  int_t *local_68;
  int *local_60;
  int_t *local_58;
  long local_50;
  long local_48;
  long local_40;
  int_t *xprune;
  
  local_98 = options->DiagPivotThresh;
  dVar17 = options->ILU_DropTol;
  local_1e8 = options->ILU_FillTol;
  uVar22 = A->nrow;
  dVar32 = (double)(ulong)uVar22;
  n = A->ncol;
  uVar27 = (ulong)n;
  n_00 = n;
  if ((int)uVar22 < (int)n) {
    n_00 = uVar22;
  }
  local_238 = options->ILU_FillFactor;
  local_1d0 = options->Fact;
  local_1f0 = (ulong)(uint)options->ILU_DropRule;
  milu = options->ILU_MILU;
  local_a8 = stat->panel_histo;
  local_b0 = stat->ops;
  piVar2 = (int_t *)A->Store;
  lVar3 = *(long *)(piVar2 + 2);
  local_1b8 = *(int_t **)(piVar2 + 4);
  local_250 = *(int_t **)(piVar2 + 6);
  local_260 = *(int_t **)(piVar2 + 8);
  local_258 = etree;
  iVar10 = zLUMemInit(local_1d0,work,lwork,uVar22,n,*piVar2,panel_size,local_238,L,U,Glu,&iwork,
                      &zwork);
  *info = iVar10;
  if (iVar10 == 0) {
    piVar4 = Glu->xsup;
    piVar5 = Glu->supno;
    piVar6 = Glu->xlsub;
    local_198 = Glu->xlusup;
    piVar7 = Glu->xusub;
    local_1f8 = A;
    SetIWork(uVar22,n,panel_size,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,&marker);
    local_180 = int32Malloc(uVar22);
    superlu_free(xprune);
    zSetRWork(uVar22,panel_size,zwork,&dense,&tempv);
    usepr = (int)(local_1d0 == SamePattern_SameRowPerm);
    if (local_1d0 == SamePattern_SameRowPerm) {
      local_118 = int32Malloc(uVar22);
      if (0 < (int)uVar22) {
        dVar19 = 0.0;
        do {
          local_118[perm_r[(long)dVar19]] = SUB84(dVar19,0);
          dVar19 = (double)((long)dVar19 + 1);
        } while (dVar32 != dVar19);
      }
    }
    else {
      local_118 = (int *)0x0;
    }
    addr = int32Malloc(n);
    if (0 < (int)n) {
      uVar14 = 0;
      do {
        addr[perm_c[uVar14]] = (int)uVar14;
        uVar14 = uVar14 + 1;
      } while (uVar27 != uVar14);
    }
    local_1c0 = intMalloc(n);
    if (0 < (int)n) {
      uVar14 = 0;
      do {
        local_1c0[uVar14] = addr[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar27 != uVar14);
    }
    iswap = intMalloc(n);
    if (0 < (int)n) {
      uVar14 = 0;
      do {
        iswap[uVar14] = perm_c[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar27 != uVar14);
    }
    lVar28 = (long)(int)n;
    amax = (double *)superlu_malloc((long)panel_size << 3);
    if ((local_1f0 & 0xe) == 0) {
      local_1c8 = (double *)0x0;
    }
    else {
      local_1c8 = (double *)superlu_malloc(lVar28 * 8);
    }
    nnzLj = 0;
    nnzUj = 0;
    iVar11 = sp_ienv(7);
    dVar19 = (double)(int)n_00;
    local_1d4 = (int)(dVar19 * 0.95);
    if (local_1d4 < (int)(n_00 + iVar11 * -2)) {
      iVar11 = sp_ienv(7);
      local_1d4 = n_00 + iVar11 * -2;
    }
    local_268 = pow((double)(int)n,-1.0 / options->ILU_MILU_Dim);
    local_190 = intMalloc(n);
    piVar15 = intMalloc(n);
    if (options->SymmetricMode == YES) {
      ilu_heap_relax_snode(n,local_258,relax,marker,local_190,piVar15);
    }
    else {
      ilu_relax_snode(n,local_258,relax,marker,local_190,piVar15);
    }
    ifill(perm_r,uVar22,-1);
    ifill(marker,uVar22 * 3,-1);
    marker_00 = local_180;
    *piVar5 = -1;
    *local_198 = 0;
    *piVar7 = 0;
    *piVar6 = 0;
    local_258 = (int *)((ulong)local_258 & 0xffffffff00000000);
    *piVar4 = 0;
    ifill(local_180,uVar22,-1);
    piVar20 = local_190;
    local_58 = piVar15;
    mark_relax(uVar22,local_190,piVar15,local_250,local_260,local_1b8,marker_00);
    if (0 < (int)n_00) {
      local_a0 = (long)(int)uVar22;
      local_240 = (double)(int)uVar22;
      local_170 = n * uVar22;
      local_40 = local_a0 * 2;
      local_c0 = local_238 * 0.9;
      local_b8 = (1.0 - local_268) + (1.0 - local_268);
      local_50 = (long)local_1d4;
      local_60 = piVar20 + 1;
      uVar14 = 0;
      local_48 = local_a0 << 3;
      local_258 = (int *)((ulong)local_258 & 0xffffffff00000000);
      local_278 = 0;
      local_268 = dVar32;
      local_248 = dVar17;
      local_188 = dVar17;
      do {
        iVar11 = (int)uVar14;
        uVar29 = (ulong)iVar11;
        uVar22 = piVar20[uVar29];
        uVar26 = (ulong)uVar22;
        if (uVar22 == 0xffffffff) {
          uVar22 = panel_size + iVar11;
          if ((int)n_00 <= panel_size + iVar11) {
            uVar22 = n_00;
          }
          uVar14 = 0;
          do {
            if ((long)(int)uVar22 <= (long)(uVar29 + 1 + uVar14)) {
              uVar22 = iVar11 + (int)uVar14 + 1;
              uVar26 = (ulong)(uint)panel_size;
              goto LAB_0010af58;
            }
            uVar26 = uVar14 + 1;
            lVar24 = uVar29 + uVar14;
            uVar14 = uVar26;
          } while (local_60[lVar24] == -1);
          uVar22 = iVar11 + (int)uVar26;
LAB_0010af58:
          iVar21 = n_00 - iVar11;
          if (uVar22 != n_00) {
            iVar21 = (int)uVar26;
          }
          local_a8[iVar21] = local_a8[iVar21] + 1;
          ilu_zpanel_dfs(SUB84(dVar32,0),iVar21,iVar11,local_1f8,perm_r,&nseg1,dense,amax,panel_lsub
                         ,segrep,repfnz,marker,parent,xplore,Glu);
          zpanel_bmod(SUB84(dVar32,0),iVar21,iVar11,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
          uVar22 = iVar11 + iVar21;
          uVar14 = (ulong)uVar22;
          if (0 < iVar21) {
            local_208 = (ulong)(int)uVar22;
            uVar26 = uVar29;
            local_70 = (ulong)uVar22;
            do {
              local_200 = uVar26 - uVar29;
              lVar23 = local_200 * local_a0;
              nseg = nseg1;
              iVar21 = local_260[uVar26];
              iVar18 = local_250[uVar26];
              lVar24 = lVar23 * 4;
              iVar25 = (int)uVar26;
              iVar12 = ilu_zcolumn_dfs(SUB84(local_268,0),iVar25,perm_r,&nseg,panel_lsub + lVar23,
                                       segrep,repfnz + lVar23,marker,parent,xplore,Glu);
              *info = iVar12;
              if (iVar12 != 0) {
                return;
              }
              iVar12 = zcolumn_bmod(iVar25,nseg - nseg1,dense + lVar23,tempv,segrep + nseg1,
                                    repfnz + lVar23,iVar11,Glu,stat);
              lVar9 = local_48;
              piVar20 = marker;
              *info = iVar12;
              if (iVar12 != 0) {
                return;
              }
              local_220 = uVar26 + 1;
              local_218 = lVar24;
              if (piVar6[uVar26 + 1] == piVar6[uVar26]) {
                nnzL = Glu->nzlmax;
                piVar15 = Glu->lsub;
                if (nnzL <= piVar6[uVar26] + 1) {
                  local_68 = piVar15;
                  iVar10 = zLUMemXpand(iVar25,piVar6[uVar26] + 1,LSUB,&nnzL,Glu);
                  if (iVar10 != 0) {
                    *info = iVar10;
                    return;
                  }
                  piVar15 = Glu->lsub;
                }
                piVar6[local_220] = piVar6[local_220] + 1;
                iVar12 = local_198[uVar26];
                if (iVar12 != local_198[local_220]) {
                  __assert_fail("xlusup[jj]==xlusup[jj+1]",
                                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsitrf.c"
                                ,0x1f5,
                                "void zgsitrf(superlu_options_t *, SuperMatrix *, int, int, int *, void *, int_t, int *, int *, SuperMatrix *, SuperMatrix *, GlobalLU_t *, SuperLUStat_t *, int_t *)"
                               );
                }
                local_198[local_220] = local_198[local_220] + 1;
                puVar1 = (undefined8 *)((long)Glu->lusup + (long)iVar12 * 0x10);
                *puVar1 = 0;
                puVar1[1] = 0;
                uVar14 = uVar26 & 0xffffffff;
                uVar16 = uVar26;
                while (((long)uVar16 < lVar28 &&
                       (uVar14 = uVar16, (long)uVar26 < (long)local_180[local_1c0[uVar16]]))) {
                  uVar16 = uVar16 + 1;
                  uVar14 = uVar27;
                }
                iVar12 = local_1c0[(int)uVar14];
                *(int *)((long)piVar20 + (long)iVar12 * 4 + lVar9) = iVar25;
                piVar15[piVar6[uVar26]] = iVar12;
              }
              local_278 = local_278 + (iVar21 - iVar18);
              if ((local_1f0 & 2) == 0) {
                if ((local_1f0 & 4) == 0) {
                  dVar32 = local_268;
                  if ((local_1f0 & 8) != 0) {
                    dVar32 = (double)(ulong)(uint)(int)((double)local_278 * local_c0 * 0.5 -
                                                       (double)nnzUj);
                  }
                }
                else {
                  dVar32 = (double)(ulong)(uint)(int)(((double)(int)local_220 *
                                                      (double)(local_260[uVar26] - local_250[uVar26]
                                                              ) * local_238) / local_240);
                }
              }
              else {
                dVar32 = (double)(ulong)(uint)(int)(((double)iVar25 *
                                                    (((double)*piVar2 * local_238) / local_240)) /
                                                   local_240);
              }
              iVar21 = ilu_zcopy_to_ucol(iVar25,nseg,segrep,(int *)((long)repfnz + local_218),perm_r
                                         ,dense + lVar23,(int)local_1f0,milu,
                                         amax[local_200] * local_188,SUB84(dVar32,0),&drop_sum,
                                         &nnzUj,Glu,local_1c8);
              *info = iVar21;
              if (iVar21 != 0) {
                return;
              }
              if ((local_1f0 & 0x10) != 0) {
                if ((double)nnzLj <= (double)local_278 * local_c0 * 0.5) {
                  dVar32 = local_188 * 0.5;
                  local_188 = dVar17;
                  if (dVar17 <= dVar32) {
                    local_188 = dVar32;
                  }
                }
                else {
                  dVar32 = local_188 + local_188;
                  local_188 = 1.0;
                  if (dVar32 <= 1.0) {
                    local_188 = dVar32;
                  }
                }
              }
              if ((((drop_sum.r != 0.0) || (NAN(drop_sum.r))) || (drop_sum.i != 0.0)) ||
                 (NAN(drop_sum.i))) {
                dVar8 = z_abs1(&drop_sum);
                dVar32 = 1.0;
                if (local_b8 / dVar8 < 1.0) {
                  dVar32 = z_abs1(&drop_sum);
                  dVar32 = local_b8 / dVar32;
                }
                drop_sum.r = drop_sum.r * dVar32;
                drop_sum.i = dVar32 * drop_sum.i;
              }
              if (usepr != 0) {
                pivrow = local_118[uVar26];
              }
              fill_tol = pow(local_1e8,1.0 - (double)iVar25 / dVar19);
              drop_sum_00.i = drop_sum.i;
              drop_sum_00.r = drop_sum.r;
              iVar21 = ilu_zpivotL(iVar25,local_98,&usepr,perm_r,addr[uVar26],local_1c0,iswap,
                                   local_180,&pivrow,fill_tol * amax[local_200],milu,drop_sum_00,Glu
                                   ,stat);
              *info = iVar21;
              if (iVar21 != 0) {
                local_258 = (int *)CONCAT44(local_258._4_4_,(int)local_258 + 1);
                marker[pivrow + local_a0] = iVar25;
                marker[pivrow + local_40] = iVar25;
              }
              resetrep_col(nseg,segrep,(int *)(local_218 + (long)repfnz));
              if (((0 < (long)uVar26) && (piVar5[uVar26 - 1] < piVar5[uVar26])) &&
                 ((long)uVar26 < local_50)) {
                iVar18 = iVar25 + -1;
                iVar21 = piVar4[piVar5[uVar26 - 1]];
                lVar24 = (long)iVar21;
                if ((local_1f0 & 2) == 0) {
                  if ((local_1f0 & 4) == 0) {
                    iVar12 = local_170;
                    if ((local_1f0 & 8) == 0) goto LAB_0010b816;
                    dVar32 = ((((double)iVar18 + 1.0) * -0.5) / local_240 + 1.0) *
                             (double)local_278 * local_238 - (double)nnzLj;
                  }
                  else {
                    dVar32 = 0.0;
                    if (lVar24 < (long)uVar26) {
                      iVar12 = 0;
                      do {
                        iVar12 = (iVar12 + local_260[lVar24]) - local_250[lVar24];
                        lVar24 = lVar24 + 1;
                      } while (lVar24 < (long)uVar26);
                      dVar32 = (double)iVar12;
                    }
                    dVar32 = ((double)(SUB84(local_268,0) - iVar21) * dVar32 * local_238) /
                             local_240;
                  }
                  iVar12 = (int)dVar32;
                }
                else {
                  iVar12 = (int)((double)(iVar25 - iVar21) *
                                (((double)(SUB84(local_268,0) - iVar21) *
                                 (((double)*piVar2 * local_238) / local_240)) / local_240));
                }
LAB_0010b816:
                fill_tol = pow(local_1e8,((double)(iVar18 + iVar21) * -0.5) / dVar19 + 1.0);
                ilu_zdrop_row(options,iVar21,iVar18,local_248,iVar12,&nnzLj,&fill_tol,Glu,&tempv->r,
                              local_1c8,1);
                if ((local_1f0 & 0x10) != 0) {
                  if ((double)nnzLj <=
                      ((((double)iVar18 + 1.0) * -0.5) / local_240 + 1.0) *
                      (double)local_278 * local_238) {
                    dVar32 = local_248 * 0.5;
                    local_248 = dVar17;
                    if (dVar17 <= dVar32) {
                      local_248 = dVar32;
                    }
                  }
                  else {
                    dVar32 = local_248 + local_248;
                    local_248 = 1.0;
                    if (dVar32 <= 1.0) {
                      local_248 = dVar32;
                    }
                  }
                }
                uVar30 = SUB84(fill_tol,0);
                uVar31 = (undefined4)((ulong)fill_tol >> 0x20);
                if (0.0 <= fill_tol) {
                  uVar30 = 0;
                  uVar31 = 0;
                }
                local_258 = (int *)CONCAT44(local_258._4_4_,
                                            (int)local_258 - (int)(double)CONCAT44(uVar31,uVar30));
              }
              uVar26 = local_220;
              dVar32 = local_268;
              uVar14 = local_70;
            } while ((long)local_220 < (long)local_208);
          }
        }
        else {
          iVar21 = uVar22 - iVar11;
          local_a8[(long)iVar21 + 1] = local_a8[(long)iVar21 + 1] + 1;
          local_208 = uVar26;
          if ((0 < iVar11) && (iVar11 < local_1d4)) {
            local_200 = CONCAT44(local_200._4_4_,iVar21);
            uVar22 = iVar11 - 1;
            iVar21 = piVar4[piVar5[uVar22]];
            uVar26 = (ulong)iVar21;
            if ((local_1f0 & 2) == 0) {
              if ((local_1f0 & 4) == 0) {
                iVar18 = local_170;
                if ((local_1f0 & 8) == 0) goto LAB_0010ba29;
                dVar32 = ((((double)(int)uVar22 + 1.0) * -0.5) / local_240 + 1.0) *
                         (double)local_278 * local_238 - (double)nnzLj;
              }
              else {
                dVar32 = 0.0;
                if (iVar21 < iVar11) {
                  iVar18 = 0;
                  do {
                    iVar18 = (iVar18 + local_260[uVar26]) - local_250[uVar26];
                    uVar26 = uVar26 + 1;
                  } while ((uVar14 & 0xffffffff) != uVar26);
                  dVar32 = (double)iVar18;
                }
                dVar32 = ((double)(SUB84(local_268,0) - iVar21) * dVar32 * local_238) / local_240;
              }
              iVar18 = (int)dVar32;
            }
            else {
              iVar18 = (int)((double)(iVar11 - iVar21) *
                            (((double)(SUB84(local_268,0) - iVar21) *
                             (((double)*piVar2 * local_238) / local_240)) / local_240));
            }
LAB_0010ba29:
            local_218 = CONCAT44(local_218._4_4_,iVar18);
            fill_tol = pow(local_1e8,((double)(int)(iVar21 + uVar22) * -0.5) / dVar19 + 1.0);
            ilu_zdrop_row(options,iVar21,uVar22,local_248,(int)local_218,&nnzLj,&fill_tol,Glu,
                          &tempv->r,local_1c8,0);
            if ((local_1f0 & 0x10) != 0) {
              if ((double)nnzLj <=
                  ((((double)(int)uVar22 + 1.0) * -0.5) / local_240 + 1.0) *
                  (double)local_278 * local_238) {
                dVar32 = local_248 * 0.5;
                local_248 = dVar17;
                if (dVar17 <= dVar32) {
                  local_248 = dVar32;
                }
              }
              else {
                dVar32 = local_248 + local_248;
                local_248 = 1.0;
                if (dVar32 <= 1.0) {
                  local_248 = dVar32;
                }
              }
            }
            uVar22 = (uint)local_208;
            uVar30 = SUB84(fill_tol,0);
            uVar31 = (undefined4)((ulong)fill_tol >> 0x20);
            if (0.0 <= fill_tol) {
              uVar30 = 0;
              uVar31 = 0;
            }
            local_258 = (int *)CONCAT44(local_258._4_4_,
                                        (int)local_258 - (int)(double)CONCAT44(uVar31,uVar30));
            iVar21 = (int)local_200;
          }
          iVar18 = ilu_zsnode_dfs(iVar11,uVar22,local_1b8,local_250,local_260,marker,Glu);
          *info = iVar18;
          if (iVar18 != 0) {
            return;
          }
          local_200 = CONCAT44(local_200._4_4_,piVar7[uVar29]);
          iVar10 = local_198[uVar29];
          local_218 = (long)piVar5[uVar29];
          iVar18 = piVar4[local_218];
          iVar12 = piVar6[(long)iVar18 + 1];
          iVar25 = piVar6[iVar18];
          nzlumax = Glu->nzlumax;
          while (nzlumax < (iVar12 - iVar25) * (iVar21 + 1) + iVar10) {
            iVar13 = zLUMemXpand(iVar11,iVar10,LUSUP,&nzlumax,Glu);
            *info = iVar13;
            if (iVar13 != 0) {
              return;
            }
          }
          dVar32 = local_268;
          if (iVar11 <= (int)local_208) {
            local_220 = CONCAT44(local_220._4_4_,(int)local_208 + 1);
            do {
              piVar7[uVar29 + 1] = (int)local_200;
              *amax = 0.0;
              lVar24 = (long)local_250[uVar29];
              iVar11 = local_260[uVar29];
              if (local_250[uVar29] < iVar11) {
                z = (doublecomplex *)(lVar24 * 0x10 + lVar3);
                do {
                  dVar32 = z_abs1(z);
                  if (*amax <= dVar32 && dVar32 != *amax) {
                    *amax = dVar32;
                  }
                  iVar11 = local_1b8[lVar24];
                  dVar32 = z->i;
                  dense[iVar11].r = z->r;
                  dense[iVar11].i = dVar32;
                  lVar24 = lVar24 + 1;
                  iVar11 = local_260[uVar29];
                  z = z + 1;
                  dVar32 = local_268;
                } while (lVar24 < iVar11);
              }
              local_278 = (local_278 + iVar11) - local_250[uVar29];
              if ((*amax == 0.0) && (!NAN(*amax))) {
                *amax = local_1e8;
              }
              iVar11 = (int)uVar29;
              zsnode_bmod(iVar11,(int)local_218,iVar18,dense,tempv,Glu,stat);
              if (usepr != 0) {
                pivrow = local_118[uVar29];
              }
              fill_tol = pow(local_1e8,1.0 - (double)iVar11 / dVar19);
              iVar11 = ilu_zpivotL(iVar11,local_98,&usepr,perm_r,addr[uVar29],local_1c0,iswap,
                                   local_180,&pivrow,fill_tol * *amax,milu,
                                   (doublecomplex)(ZEXT416(0) << 0x40),Glu,stat);
              *info = iVar11;
              if (iVar11 != 0) {
                local_258 = (int *)CONCAT44(local_258._4_4_,(int)local_258 + 1);
                marker[pivrow] = (int)local_208;
              }
              uVar29 = uVar29 + 1;
            } while ((int)local_220 != (int)uVar29);
          }
          uVar14 = (ulong)((int)local_208 + 1);
        }
        piVar20 = local_190;
      } while ((int)uVar14 < (int)n_00);
    }
    *info = (int)local_258;
    if (0 < SUB84(dVar32,0) && (int)n < SUB84(dVar32,0)) {
      dVar17 = 0.0;
      iVar11 = 0;
      do {
        if (perm_r[(long)dVar17] == -1) {
          perm_r[(long)dVar17] = n + iVar11;
          iVar11 = iVar11 + 1;
        }
        dVar17 = (double)((long)dVar17 + 1);
      } while (dVar32 != dVar17);
    }
    ilu_countnz(n_00,&nnzL,&nnzU,Glu);
    fixupL(n_00,perm_r,Glu);
    zLUWorkFree(iwork,zwork,Glu);
    superlu_free(xplore);
    superlu_free(local_180);
    if (local_1d0 == SamePattern_SameRowPerm) {
      piVar2 = (int_t *)L->Store;
      *piVar2 = nnzL;
      piVar2[1] = Glu->supno[lVar28];
      *(void **)(piVar2 + 2) = Glu->lusup;
      *(int_t **)(piVar2 + 4) = Glu->xlusup;
      *(int_t **)(piVar2 + 6) = Glu->lsub;
      *(int_t **)(piVar2 + 8) = Glu->xlsub;
      piVar2 = (int_t *)U->Store;
      *piVar2 = nnzU;
      *(void **)(piVar2 + 2) = Glu->ucol;
      *(int_t **)(piVar2 + 4) = Glu->usub;
      *(int_t **)(piVar2 + 6) = Glu->xusub;
    }
    else {
      zCreate_SuperNode_Matrix
                (L,local_1f8->nrow,n_00,nnzL,(doublecomplex *)Glu->lusup,Glu->xlusup,Glu->lsub,
                 Glu->xlsub,Glu->supno,Glu->xsup,SLU_SC,SLU_Z,SLU_TRLU);
      zCreate_CompCol_Matrix
                (U,n_00,n_00,nnzU,(doublecomplex *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_Z,
                 SLU_TRU);
    }
    local_b0[7] = local_b0[0x13] + local_b0[0x14] + local_b0[7];
    iVar11 = Glu->num_expansions + -1;
    Glu->num_expansions = iVar11;
    stat->expansions = iVar11;
    if (local_1d0 == SamePattern_SameRowPerm) {
      superlu_free(local_118);
    }
    superlu_free(addr);
    superlu_free(local_190);
    superlu_free(local_1c0);
    superlu_free(iswap);
    superlu_free(local_58);
    superlu_free(amax);
    if (local_1c8 != (double *)0x0) {
      superlu_free(local_1c8);
    }
  }
  return;
}

Assistant:

void
zgsitrf(superlu_options_t *options, SuperMatrix *A, int relax, int panel_size,
	int *etree, void *work, int_t lwork, int *perm_c, int *perm_r,
	SuperMatrix *L, SuperMatrix *U, 
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
	SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when
				  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *swap, *iswap; /* swap is used to store the row permutation
				during the factorization. Initially, it is set
				to iperm_c (row indices of Pc*A*Pc').
				iswap is the inverse of swap. After the
				factorization, it is equal to perm_r. */
    int       *iwork;
    doublecomplex   *zwork;
    int       *segrep, *repfnz, *parent;
    int_t     *xplore;
    int       *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int       *marker;
    int       *marker_relax;
    doublecomplex    *dense, *tempv;
    double *dtempv;
    int       *relax_end, *relax_fsupc;
    doublecomplex    *a;
    int_t     *asub;
    int_t     *xa_begin, *xa_end;
    int       *xsup, *supno;
    int_t     *xlsub, *xlusup, *xusub;
    int_t     nzlumax;
    double    *amax; 
    doublecomplex    drop_sum;
    double alpha, omega;  /* used in MILU, mimicking DRIC */
    double    *dwork2;	   /* used by the second dropping rule */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    double    drop_tol = options->ILU_DropTol; /* tau */
    double    fill_ini = options->ILU_FillTol; /* tau^hat */
    double    gamma = options->ILU_FillFactor;
    int       drop_rule = options->ILU_DropRule;
    milu_t    milu = options->ILU_MILU;
    double    fill_tol;
    int       pivrow;	/* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo;
    int       m, n, min_mn, jsupno, fsupc;
    int_t     new_next, nextlu, nextu;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    int       last_drop;/* the last column which the dropping rules applied */
    int       quota;
    int       nnzAj;	/* number of nonzeros in A(:,1:j) */
    int       nnzLj, nnzUj;
    double    tol_L = drop_tol, tol_U = drop_tol;
    doublecomplex zero = {0.0, 0.0};
    double one = 1.0;

    /* Executable */	   
    iinfo    = 0;
    m	     = A->nrow;
    n	     = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a	     = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = zLUMemInit(fact, work, lwork, m, n, Astore->nnz, panel_size,
		       gamma, L, U, Glu, &iwork, &zwork);
    if ( *info ) return;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;

    int_t *xprune;
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    marker_relax = int32Malloc(m);
    SUPERLU_FREE(xprune); /* not used in ILU */
    
    zSetRWork(m, panel_size, zwork, &dense, &tempv);

    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }

    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;
    swap = (int *)intMalloc(n);
    for (k = 0; k < n; k++) swap[k] = iperm_c[k];
    iswap = (int *)intMalloc(n);
    for (k = 0; k < n; k++) iswap[k] = perm_c[k];
    amax = (double *) SUPERLU_MALLOC(panel_size * sizeof(double));
    if (drop_rule & DROP_SECONDARY)
	dwork2 = SUPERLU_MALLOC(n * sizeof(double));
    else
	dwork2 = NULL;

    nnzAj = 0;
    nnzLj = 0;
    nnzUj = 0;
    last_drop = SUPERLU_MAX(min_mn - 2 * sp_ienv(7), (int)(min_mn * 0.95));
    alpha = pow((double)n, -1.0 / options->ILU_MILU_Dim);

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    relax_fsupc = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES )
	ilu_heap_relax_snode(n, etree, relax, marker, relax_end, relax_fsupc);
    else
	ilu_relax_snode(n, etree, relax, marker, relax_end, relax_fsupc);

    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* Mark the rows used by relaxed supernodes */
    ifill (marker_relax, m, SLU_EMPTY);
    i = mark_relax(m, relax_end, relax_fsupc, xa_begin, xa_end,
	         asub, marker_relax);
#if ( PRNTlevel >= 1)
    printf("%d relaxed supernodes.\n", (int)i);
#endif

    /*
     * Work on one "panel" at a time. A panel is one of the following:
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* Drop small rows in the previous supernode. */
	    if (jcol > 0 && jcol < last_drop) {
		int first = xsup[supno[jcol - 1]];
		int last = jcol - 1;
		int quota;

		/* Compute the quota */
		if (drop_rule & DROP_PROWS)
		    quota = gamma * Astore->nnz / m * (m - first) / m
			    * (last - first + 1);
		else if (drop_rule & DROP_COLUMN) {
		    int i;
		    quota = 0;
		    for (i = first; i <= last; i++)
			quota += xa_end[i] - xa_begin[i];
		    quota = gamma * quota * (m - first) / m;
		} else if (drop_rule & DROP_AREA)
		    quota = gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
			    - nnzLj;
		else
		    quota = m * n;
		fill_tol = pow(fill_ini, 1.0 - 0.5 * (first + last) / min_mn);

		/* Drop small rows */
                dtempv = (double *) tempv;
		i = ilu_zdrop_row(options, first, last, tol_L, quota, &nnzLj,
				  &fill_tol, Glu, dtempv, dwork2, 0);
		/* Reset the parameters */
		if (drop_rule & DROP_DYNAMIC) {
		    if (gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
			     < nnzLj)
			tol_L = SUPERLU_MIN(1.0, tol_L * 2.0);
		    else
			tol_L = SUPERLU_MAX(drop_tol, tol_L * 0.5);
		}
		if (fill_tol < 0) iinfo -= (int)fill_tol;
#ifdef DEBUG
		num_drop_L += i * (last - first + 1);
#endif
	    }

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol)
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = ilu_zsnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
					 marker, Glu)) != 0 )
		return;

	    nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ((*info = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)))
		    return;
	    }

	    for (icol = jcol; icol <= kcol; icol++) {
		xusub[icol+1] = nextu;

		amax[0] = 0.0;
		/* Scatter into SPA dense[*] */
		for (k = xa_begin[icol]; k < xa_end[icol]; k++) {
                    register double tmp = z_abs1 (&a[k]);
		    if (tmp > amax[0]) amax[0] = tmp;
		    dense[asub[k]] = a[k];
		}
		nnzAj += xa_end[icol] - xa_begin[icol];
		if (amax[0] == 0.0) {
		    amax[0] = fill_ini;
#if ( PRNTlevel >= 1)
		    printf("Column %d is entirely zero!\n", icol);
		    fflush(stdout);
#endif
		}

		/* Numeric update within the snode */
		zsnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if (usepr) pivrow = iperm_r[icol];
		fill_tol = pow(fill_ini, 1.0 - (double)icol / (double)min_mn);
		if ( (*info = ilu_zpivotL(icol, diag_pivot_thresh, &usepr,
					  perm_r, iperm_c[icol], swap, iswap,
					  marker_relax, &pivrow,
                                          amax[0] * fill_tol, milu, zero,
                                          Glu, stat)) ) {
		    iinfo++;
		    marker[pivrow] = kcol;
		}

	    }

	    jcol = kcol + 1;

	} else { /* Work on one panel of panel_size columns */

	    /* Adjust panel_size so that a panel won't overlap with the next
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++)
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    ilu_zpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
                          dense, amax, panel_lsub, segrep, repfnz,
                          marker, parent, xplore, Glu);

	    /* numeric sup-panel updates in topological order */
	    zpanel_bmod(m, panel_size, jcol, nseg1, dense,
			tempv, segrep, repfnz, Glu, stat);

	    /* Sparse LU within the panel, and below panel diagonal */
	    for (jj = jcol; jj < jcol + panel_size; jj++) {

		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

		nnzAj += xa_end[jj] - xa_begin[jj];

		if ((*info = ilu_zcolumn_dfs(m, jj, perm_r, &nseg,
					     &panel_lsub[k], segrep, &repfnz[k],
					     marker, parent, xplore, Glu)))
		    return;

		/* Numeric updates */
		if ((*info = zcolumn_bmod(jj, (nseg - nseg1), &dense[k],
					  tempv, &segrep[nseg1], &repfnz[k],
					  jcol, Glu, stat)) != 0) return;

		/* Make a fill-in position if the column is entirely zero */
		if (xlsub[jj + 1] == xlsub[jj]) {
		    register int i, row;
		    int_t nextl;
		    int_t nzlmax = Glu->nzlmax;
		    int_t *lsub = Glu->lsub;
		    int *marker2 = marker + 2 * m;

		    /* Allocate memory */
		    nextl = xlsub[jj] + 1;
		    if (nextl >= nzlmax) {
			int error = zLUMemXpand(jj, nextl, LSUB, &nzlmax, Glu);
			if (error) { *info = error; return; }
			lsub = Glu->lsub;
		    }
		    xlsub[jj + 1]++;
		    assert(xlusup[jj]==xlusup[jj+1]);
		    xlusup[jj + 1]++;
		    ((doublecomplex *) Glu->lusup)[xlusup[jj]] = zero;

		    /* Choose a row index (pivrow) for fill-in */
		    for (i = jj; i < n; i++)
			if (marker_relax[swap[i]] <= jj) break;
		    row = swap[i];
		    marker2[row] = jj;
		    lsub[xlsub[jj]] = row;
#ifdef DEBUG
		    printf("Fill col %d.\n", (int)jj);
		    fflush(stdout);
#endif
		}

		/* Computer the quota */
		if (drop_rule & DROP_PROWS)
		    quota = gamma * Astore->nnz / m * jj / m;
		else if (drop_rule & DROP_COLUMN)
		    quota = gamma * (xa_end[jj] - xa_begin[jj]) *
			    (jj + 1) / m;
		else if (drop_rule & DROP_AREA)
		    quota = gamma * 0.9 * nnzAj * 0.5 - nnzUj;
		else
		    quota = m;

		/* Copy the U-segments to ucol[*] and drop small entries */
		if ((*info = ilu_zcopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					       perm_r, &dense[k], drop_rule,
					       milu, amax[jj - jcol] * tol_U,
					       quota, &drop_sum, &nnzUj, Glu,
					       dwork2)) != 0)
		    return;

		/* Reset the dropping threshold if required */
		if (drop_rule & DROP_DYNAMIC) {
		    if (gamma * 0.9 * nnzAj * 0.5 < nnzLj)
			tol_U = SUPERLU_MIN(1.0, tol_U * 2.0);
		    else
			tol_U = SUPERLU_MAX(drop_tol, tol_U * 0.5);
		}

		if (drop_sum.r != 0.0 || drop_sum.i != 0.0)
		{
                    omega = SUPERLU_MIN(2.0*(1.0-alpha)/z_abs1(&drop_sum), 1.0);
                    zd_mult(&drop_sum, &drop_sum, omega);
		}
		if (usepr) pivrow = iperm_r[jj];
		fill_tol = pow(fill_ini, 1.0 - (double)jj / (double)min_mn);
		if ( (*info = ilu_zpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
					  iperm_c[jj], swap, iswap,
					  marker_relax, &pivrow,
					  amax[jj - jcol] * fill_tol, milu,
					  drop_sum, Glu, stat)) ) {
		    iinfo++;
		    marker[m + pivrow] = jj;
		    marker[2 * m + pivrow] = jj;
		}

		/* Reset repfnz[] for this column */
		resetrep_col (nseg, segrep, &repfnz[k]);

		/* Start a new supernode, drop the previous one */
		if (jj > 0 && supno[jj] > supno[jj - 1] && jj < last_drop) {
		    int first = xsup[supno[jj - 1]];
		    int last = jj - 1;
		    int quota;

		    /* Compute the quota */
		    if (drop_rule & DROP_PROWS)
			quota = gamma * Astore->nnz / m * (m - first) / m
				* (last - first + 1);
		    else if (drop_rule & DROP_COLUMN) {
			int i;
			quota = 0;
			for (i = first; i <= last; i++)
			    quota += xa_end[i] - xa_begin[i];
			quota = gamma * quota * (m - first) / m;
		    } else if (drop_rule & DROP_AREA)
			quota = gamma * nnzAj * (1.0 - 0.5 * (last + 1.0)
				/ m) - nnzLj;
		    else
			quota = m * n;
		    fill_tol = pow(fill_ini, 1.0 - 0.5 * (first + last) /
			    (double)min_mn);

		    /* Drop small rows */
                    dtempv = (double *) tempv;
		    i = ilu_zdrop_row(options, first, last, tol_L, quota,
				      &nnzLj, &fill_tol, Glu, dtempv, dwork2,
				      1);

		    /* Reset the parameters */
		    if (drop_rule & DROP_DYNAMIC) {
			if (gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
				< nnzLj)
			    tol_L = SUPERLU_MIN(1.0, tol_L * 2.0);
			else
			    tol_L = SUPERLU_MAX(drop_tol, tol_L * 0.5);
		    }
		    if (fill_tol < 0) iinfo -= (int)fill_tol;
#ifdef DEBUG
		    num_drop_L += i * (last - first + 1);
#endif
		} /* if start a new supernode */

	    } /* for */

	    jcol += panel_size; /* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    if ( m > n ) {
	k = 0;
	for (i = 0; i < m; ++i)
	    if ( perm_r[i] == SLU_EMPTY ) {
		perm_r[i] = n + k;
		++k;
	    }
    }

    ilu_countnz(min_mn, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    zLUWorkFree(iwork, zwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE (xplore);
    SUPERLU_FREE (marker_relax);

    if ( fact == SamePattern_SameRowPerm ) {
	/* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
	   may have changed, */
	((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (doublecomplex *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (doublecomplex *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
	zCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL,
              (doublecomplex *) Glu->lusup, Glu->xlusup,
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
	      SLU_SC, SLU_Z, SLU_TRLU);
	zCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU,
	      (doublecomplex *) Glu->ucol, Glu->usub, Glu->xusub,
	      SLU_NC, SLU_Z, SLU_TRU);
    }

    ops[FACT] += ops[TRSV] + ops[GEMV];
    stat->expansions = --(Glu->num_expansions);

    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);
    SUPERLU_FREE (swap);
    SUPERLU_FREE (iswap);
    SUPERLU_FREE (relax_fsupc);
    SUPERLU_FREE (amax);
    if ( dwork2 ) SUPERLU_FREE (dwork2);

}